

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

int emit_dqt(j_compress_ptr cinfo,int index)

{
  JQUANT_TBL *pJVar1;
  int value;
  int in_ESI;
  j_compress_ptr in_RDI;
  uint qval;
  int i;
  int prec;
  JQUANT_TBL *qtbl;
  JPEG_MARKER in_stack_ffffffffffffffcc;
  j_compress_ptr in_stack_ffffffffffffffd0;
  j_compress_ptr cinfo_00;
  int local_20;
  int local_1c;
  
  pJVar1 = in_RDI->quant_tbl_ptrs[in_ESI];
  if (pJVar1 == (JQUANT_TBL *)0x0) {
    in_RDI->err->msg_code = 0x36;
    (in_RDI->err->msg_parm).i[0] = in_ESI;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  local_1c = 0;
  for (local_20 = 0; local_20 <= in_RDI->lim_Se; local_20 = local_20 + 1) {
    if (0xff < pJVar1->quantval[in_RDI->natural_order[local_20]]) {
      local_1c = 1;
    }
  }
  if (pJVar1->sent_table == 0) {
    emit_marker(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (local_1c == 0) {
      value = in_RDI->lim_Se + 4;
    }
    else {
      value = in_RDI->lim_Se * 2 + 5;
    }
    cinfo_00 = in_RDI;
    emit_2bytes(in_RDI,value);
    emit_byte(cinfo_00,value);
    for (local_20 = 0; local_20 <= in_RDI->lim_Se; local_20 = local_20 + 1) {
      if (local_1c != 0) {
        emit_byte(cinfo_00,value);
      }
      emit_byte(cinfo_00,value);
    }
    pJVar1->sent_table = 1;
  }
  return local_1c;
}

Assistant:

LOCAL(int)
emit_dqt (j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL * qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i <= cinfo->lim_Se; i++) {
    if (qtbl->quantval[cinfo->natural_order[i]] > 255)
      prec = 1;
  }

  if (! qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo,
      prec ? cinfo->lim_Se * 2 + 2 + 1 + 2 : cinfo->lim_Se + 1 + 1 + 2);

    emit_byte(cinfo, index + (prec<<4));

    for (i = 0; i <= cinfo->lim_Se; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[cinfo->natural_order[i]];
      if (prec)
	emit_byte(cinfo, (int) (qval >> 8));
      emit_byte(cinfo, (int) (qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}